

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

pcp_server_state_e handle_version_negotiation(pcp_server_t *s)

{
  pcp_flow_t *local_20;
  pcp_flow_t *ping_msg;
  pcp_server_t *s_local;
  
  if (s->next_version == s->pcp_version) {
    s->next_version = s->next_version + 0xff;
  }
  if (s->pcp_version == '\0') {
    pcp_logger(PCP_LOGLVL_WARN,
               "Version negotiation failed for PCP server %s. Disabling sending PCP messages to this server."
               ,s->pcp_server_paddr);
    s_local._4_4_ = pss_set_not_working;
  }
  else {
    pcp_logger(PCP_LOGLVL_INFO,"Version %d not supported by server %s. Trying version %d.",
               (ulong)s->pcp_version,s->pcp_server_paddr,(ulong)s->next_version);
    s->pcp_version = s->next_version;
    local_20 = s->ping_flow_msg;
    if (s->pcp_version == '\0') {
      if (local_20 != (pcp_flow_t *)0x0) {
        local_20->state = pfs_wait_for_server_init;
        (local_20->timeout).tv_sec = 0;
        (local_20->timeout).tv_usec = 0;
      }
      local_20 = create_natpmp_ann_msg(s);
    }
    if ((local_20 == (pcp_flow_t *)0x0) &&
       (local_20 = get_ping_msg(s), local_20 == (pcp_flow_t *)0x0)) {
      (s->next_timeout).tv_sec = 0;
      (s->next_timeout).tv_usec = 0;
      s_local._4_4_ = pss_ping;
    }
    else {
      local_20->retry_count = 0;
      local_20->resend_timeout = 0;
      handle_flow_event(local_20,fev_send,(pcp_recv_msg_t *)0x0);
      if (local_20->state == pfs_failed) {
        s_local._4_4_ = pss_set_not_working;
      }
      else {
        (s->next_timeout).tv_sec = (local_20->timeout).tv_sec;
        (s->next_timeout).tv_usec = (local_20->timeout).tv_usec;
        s_local._4_4_ = pss_wait_ping_resp;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

static pcp_server_state_e handle_version_negotiation(pcp_server_t *s) {
    pcp_flow_t *ping_msg;

    if (s->next_version == s->pcp_version) {
        s->next_version--;
    }

    if (s->pcp_version == 0
#if PCP_MIN_SUPPORTED_VERSION > 0
        || (s->next_version < PCP_MIN_SUPPORTED_VERSION)
#endif
    ) {
        PCP_LOG(PCP_LOGLVL_WARN,
                "Version negotiation failed for PCP server %s. "
                "Disabling sending PCP messages to this server.",
                s->pcp_server_paddr);

        return pss_set_not_working;
    }

    PCP_LOG(PCP_LOGLVL_INFO,
            "Version %d not supported by server %s. Trying version %d.",
            s->pcp_version, s->pcp_server_paddr, s->next_version);
    s->pcp_version = s->next_version;

    ping_msg = s->ping_flow_msg;

#ifndef PCP_DISABLE_NATPMP
    if (s->pcp_version == 0) {
        if (ping_msg) {
            ping_msg->state = pfs_wait_for_server_init;
            ping_msg->timeout.tv_sec = 0;
            ping_msg->timeout.tv_usec = 0;
        }
        ping_msg = create_natpmp_ann_msg(s);
    }
#endif

    if (!ping_msg) {
        ping_msg = get_ping_msg(s);
        if (!ping_msg) {
            s->next_timeout.tv_sec = 0;
            s->next_timeout.tv_usec = 0;
            return pss_ping;
        }
    }

    ping_msg->retry_count = 0;
    ping_msg->resend_timeout = 0;

    handle_flow_event(ping_msg, fev_send, NULL);
    if (ping_msg->state == pfs_failed) {
        return pss_set_not_working;
    }

    s->next_timeout = ping_msg->timeout;

    return pss_wait_ping_resp;
}